

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSON.cc
# Opt level: O0

partial_ordering __thiscall phosg::JSON::operator<=>(JSON *this,dict_type *v)

{
  bool bVar1;
  partial_ordering pVar2;
  add_pointer_t<const_variant_alternative_t<6UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
  this_00;
  size_type sVar3;
  size_type sVar4;
  reference __k;
  mapped_type *this_01;
  type this_02;
  type other;
  out_of_range *anon_var_0;
  mapped_type *item;
  value_type *it;
  const_iterator __end1;
  const_iterator __begin1;
  dict_type *__range1;
  dict_type *stored_v;
  dict_type *v_local;
  JSON *this_local;
  
  this_00 = ::std::
            get_if<6ul,decltype(nullptr),bool,long,double,std::__cxx11::string,std::vector<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::allocator<std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>,std::unordered_map<std::__cxx11::string,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<phosg::JSON,std::default_delete<phosg::JSON>>>>>>
                      (&this->value);
  if (this_00 ==
      (add_pointer_t<const_variant_alternative_t<6UL,_variant<std::nullptr_t,_bool,_long,_double,_basic_string<char,_char_traits<char>,_allocator<char>_>,_vector<unique_ptr<JSON,_default_delete<JSON>_>,_allocator<unique_ptr<JSON,_default_delete<JSON>_>_>_>,_unordered_map<basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>,_hash<string>,_equal_to<basic_string<char,_char_traits<char>,_allocator<char>_>_>,_allocator<pair<const_basic_string<char,_char_traits<char>,_allocator<char>_>,_unique_ptr<JSON,_default_delete<JSON>_>_>_>_>_>_>_>
       )0x0) {
    this_local._7_1_ = '\x02';
  }
  else {
    sVar3 = ::std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
            ::size(this_00);
    sVar4 = ::std::
            unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
            ::size(v);
    if (sVar3 == sVar4) {
      __end1 = ::std::
               unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
               ::begin(v);
      it = (value_type *)
           ::std::
           unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
           ::end(v);
      while (bVar1 = ::std::__detail::operator==
                               (&__end1.
                                 super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_true>
                                ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_true>
                                  *)&it), ((bVar1 ^ 0xffU) & 1) != 0) {
        __k = ::std::__detail::
              _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>
              ::operator*(&__end1);
        this_01 = ::std::
                  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>_>_>
                  ::at(this_00,&__k->first);
        this_02 = ::std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>::operator*
                            (this_01);
        other = ::std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>::operator*
                          (&__k->second);
        pVar2 = operator<=>(this_02,other);
        bVar1 = ::std::operator==(pVar2,(partial_ordering)0x0);
        if (((bVar1 ^ 0xffU) & 1) != 0) {
          return (partial_ordering)'\x02';
        }
        ::std::__detail::
        _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<phosg::JSON,_std::default_delete<phosg::JSON>_>_>,_false,_true>
        ::operator++(&__end1);
      }
      this_local._7_1_ = '\0';
    }
    else {
      this_local._7_1_ = '\x02';
    }
  }
  return (partial_ordering)this_local._7_1_;
}

Assistant:

partial_ordering JSON::operator<=>(const dict_type& v) const {
  const dict_type* stored_v = get_if<6>(&this->value);
  if (stored_v == nullptr) {
    return partial_ordering::unordered;
  }
  // If the dict sizes are equal and all key/value pairs match, then the overall
  // result is equality; otherwise, it's inequality. There is no ordering for
  // dictionary-typed values.
  if (stored_v->size() != v.size()) {
    return partial_ordering::unordered;
  }
  for (const auto& it : v) {
    try {
      const auto& item = stored_v->at(it.first);
      if ((*item <=> *it.second) != partial_ordering::equivalent) {
        return partial_ordering::unordered;
      }
    } catch (const out_of_range&) {
      return partial_ordering::unordered;
    }
  }
  // If we get here, then there were the same number of keys in both maps, all
  // keys in v were also in stored_v, and the corresponding values were all
  // equal. Therefore, the overall maps are equivalent.
  return partial_ordering::equivalent;
}